

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::loadConstructedPoint<(TasGrid::RuleLocal::erule)3>
          (GridLocalPolynomial *this,double *x,int numx,double *y)

{
  int iVar1;
  bool bVar2;
  double *pdVar3;
  reference pvVar4;
  pointer pSVar5;
  double *pdVar6;
  allocator<double> local_161;
  undefined1 local_160 [52];
  int local_12c;
  undefined1 local_128 [4];
  int i_2;
  Wrapper2D<const_double> wrapy;
  MultiIndexSet local_f0;
  int *local_c8;
  int *local_c0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b8;
  int local_ac;
  undefined1 local_a8 [4];
  int i_1;
  Data2D<int> combined_pnts;
  int local_68;
  int i;
  allocator<std::vector<int,_std::allocator<int>_>_> local_51;
  undefined1 local_50 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  pnts;
  Wrapper2D<const_double> wrapx;
  double *y_local;
  int numx_local;
  double *x_local;
  GridLocalPolynomial *this_local;
  
  Utils::Wrapper2D<const_double>::Wrapper2D
            ((Wrapper2D<const_double> *)
             &pnts.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (this->super_BaseCanonicalGrid).num_dimensions,x);
  ::std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_51);
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_50,(long)numx,&local_51);
  ::std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_51);
  for (local_68 = 0; local_68 < numx; local_68 = local_68 + 1) {
    pdVar3 = Utils::Wrapper2D<const_double>::getStrip
                       ((Wrapper2D<const_double> *)
                        &pnts.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,local_68);
    getMultiIndex<(TasGrid::RuleLocal::erule)3>
              ((vector<int,_std::allocator<int>_> *)
               &combined_pnts.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,this,pdVar3);
    pvVar4 = ::std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_50,(long)local_68);
    ::std::vector<int,_std::allocator<int>_>::operator=
              (pvVar4,(vector<int,_std::allocator<int>_> *)
                      &combined_pnts.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    ::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &combined_pnts.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  pSVar5 = ::std::
           unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
           ::operator->((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                         *)&this->dynamic_values);
  bVar2 = MultiIndexSet::empty(&pSVar5->initial_points);
  if (!bVar2) {
    Data2D<int>::Data2D<int,int>
              ((Data2D<int> *)local_a8,(this->super_BaseCanonicalGrid).num_dimensions,numx);
    for (local_ac = 0; local_ac < numx; local_ac = local_ac + 1) {
      pvVar4 = ::std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_50,(long)local_ac);
      local_b8._M_current = (int *)::std::vector<int,_std::allocator<int>_>::begin(pvVar4);
      iVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
      local_c0 = (int *)Data2D<int>::getIStrip((Data2D<int> *)local_a8,local_ac);
      local_c8 = (int *)::std::
                        copy_n<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                                  (local_b8,iVar1,
                                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )local_c0);
    }
    pSVar5 = ::std::
             unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ::operator->((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                           *)&this->dynamic_values);
    MultiIndexSet::MultiIndexSet((MultiIndexSet *)&wrapy.data,(Data2D<int> *)local_a8);
    MultiIndexSet::operator-(&local_f0,&pSVar5->initial_points,(MultiIndexSet *)&wrapy.data);
    pSVar5 = ::std::
             unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ::operator->((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                           *)&this->dynamic_values);
    MultiIndexSet::operator=(&pSVar5->initial_points,&local_f0);
    MultiIndexSet::~MultiIndexSet(&local_f0);
    MultiIndexSet::~MultiIndexSet((MultiIndexSet *)&wrapy.data);
    Data2D<int>::~Data2D((Data2D<int> *)local_a8);
  }
  Utils::Wrapper2D<const_double>::Wrapper2D
            ((Wrapper2D<const_double> *)local_128,(this->super_BaseCanonicalGrid).num_outputs,y);
  for (local_12c = 0; local_12c < numx; local_12c = local_12c + 1) {
    pSVar5 = ::std::
             unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ::operator->((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                           *)&this->dynamic_values);
    pvVar4 = ::std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_50,(long)local_12c);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_160,pvVar4);
    pdVar3 = Utils::Wrapper2D<const_double>::getStrip
                       ((Wrapper2D<const_double> *)local_128,local_12c);
    pdVar6 = Utils::Wrapper2D<const_double>::getStrip
                       ((Wrapper2D<const_double> *)local_128,local_12c);
    iVar1 = (this->super_BaseCanonicalGrid).num_outputs;
    ::std::allocator<double>::allocator(&local_161);
    ::std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)(local_160 + 0x18),pdVar3,pdVar6 + iVar1,
               &local_161);
    ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::push_front
              (&pSVar5->data,(NodeData *)local_160);
    NodeData::~NodeData((NodeData *)local_160);
    ::std::allocator<double>::~allocator(&local_161);
  }
  loadConstructedPoints<(TasGrid::RuleLocal::erule)3>(this);
  Utils::Wrapper2D<const_double>::~Wrapper2D((Wrapper2D<const_double> *)local_128);
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_50);
  Utils::Wrapper2D<const_double>::~Wrapper2D
            ((Wrapper2D<const_double> *)
             &pnts.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void GridLocalPolynomial::loadConstructedPoint(const double x[], int numx, const double y[]){
    Utils::Wrapper2D<const double> wrapx(num_dimensions, x);
    std::vector<std::vector<int>> pnts(numx);
    #pragma omp parallel for
    for(int i=0; i<numx; i++)
        pnts[i] = getMultiIndex<effrule>(wrapx.getStrip(i));

    if (!dynamic_values->initial_points.empty()){
        Data2D<int> combined_pnts(num_dimensions, numx);
        for(int i=0; i<numx; i++)
            std::copy_n(pnts[i].begin(), num_dimensions, combined_pnts.getIStrip(i));
        dynamic_values->initial_points = dynamic_values->initial_points - combined_pnts;
    }

    Utils::Wrapper2D<const double> wrapy(num_outputs, y);
    for(int i=0; i<numx; i++)
        dynamic_values->data.push_front({std::move(pnts[i]), std::vector<double>(wrapy.getStrip(i), wrapy.getStrip(i) + num_outputs)});

    loadConstructedPoints<effrule>();
}